

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string *a,string *b)

{
  __type _Var1;
  NameEquality NVar2;
  string local_70;
  string local_50;
  
  ToUpper(&local_50,a);
  ToUpper(&local_70,b);
  _Var1 = std::operator==(&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  NVar2 = NO_MATCH;
  if (_Var1) {
    _Var1 = std::operator==(a,b);
    NVar2 = EQUAL_IGNORE_CASE - _Var1;
  }
  return NVar2;
}

Assistant:

NameEquality CheckNameEquality(const string& a, const string& b) {
  if (ToUpper(a) == ToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}